

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O2

string_view __thiscall cinatra::http_parser::get_header_value(http_parser *this,string_view key)

{
  char **ppcVar1;
  bool bVar2;
  char **ppcVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  string_view sVar7;
  
  uVar6 = 0xffffffffffffffff;
  sVar5 = 0;
  ppcVar1 = &(this->headers_)._M_elems[0].name._M_str;
  do {
    ppcVar3 = ppcVar1;
    uVar6 = uVar6 + 1;
    if (this->num_headers_ <= uVar6) {
      pcVar4 = (char *)0x0;
      goto LAB_00143d4b;
    }
    bVar2 = std::
            __equal4<char_const*,char_const*,cinatra::iequal0(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::_lambda(char,char)_1_>
                      (*ppcVar3,*ppcVar3 + ((string_view *)(ppcVar3 + -1))->_M_len,key._M_str,
                       key._M_str + key._M_len);
    ppcVar1 = ppcVar3 + 4;
  } while (!bVar2);
  sVar5 = (size_t)ppcVar3[1];
  pcVar4 = ppcVar3[2];
LAB_00143d4b:
  sVar7._M_str = pcVar4;
  sVar7._M_len = sVar5;
  return sVar7;
}

Assistant:

std::string_view get_header_value(std::string_view key) const {
    for (size_t i = 0; i < num_headers_; i++) {
      if (iequal0(headers_[i].name, key))
        return headers_[i].value;
    }
    return {};
  }